

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opl.cpp
# Opt level: O0

ssize_t __thiscall ymfm::ymf278b::write(ymf278b *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  ssize_t extraout_RAX_02;
  ssize_t extraout_RAX_03;
  ssize_t extraout_RAX_04;
  ssize_t extraout_RAX_05;
  ssize_t sVar1;
  uint local_1c;
  uint8_t local_15;
  int local_14;
  uint8_t data_local;
  ymf278b *pyStack_10;
  uint32_t offset_local;
  ymf278b *this_local;
  
  local_15 = (uint8_t)__buf;
  local_14 = __fd;
  pyStack_10 = this;
  switch(__fd & 7) {
  case 0:
    write_address(this,local_15);
    sVar1 = extraout_RAX;
    break;
  case 1:
    write_data(this,local_15);
    sVar1 = extraout_RAX_00;
    break;
  case 2:
    write_address_hi(this,local_15);
    sVar1 = extraout_RAX_01;
    break;
  case 3:
    write_data(this,local_15);
    sVar1 = extraout_RAX_02;
    break;
  case 4:
    write_address_pcm(this,local_15);
    sVar1 = extraout_RAX_03;
    break;
  case 5:
    write_data_pcm(this,local_15);
    sVar1 = extraout_RAX_04;
    break;
  default:
    local_1c = __fd & 7;
    debug::log_unexpected_read_write<char_const(&)[39],unsigned_int>
              ((char (*) [39])"Unexpected write to ymf278b offset %d\n",&local_1c);
    sVar1 = extraout_RAX_05;
  }
  return sVar1;
}

Assistant:

void ymf278b::write(uint32_t offset, uint8_t data)
{
	switch (offset & 7)
	{
		case 0: // address port
			write_address(data);
			break;

		case 1: // data port
			write_data(data);
			break;

		case 2: // address port
			write_address_hi(data);
			break;

		case 3: // data port
			write_data(data);
			break;

		case 4: // PCM address port
			write_address_pcm(data);
			break;

		case 5: // PCM address port
			write_data_pcm(data);
			break;

		default:
			debug::log_unexpected_read_write("Unexpected write to ymf278b offset %d\n", offset & 7);
			break;
	}
}